

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_using_recvmmsg(uv_udp_t *handle)

{
  uv_udp_t *handle_local;
  
  if ((handle->flags & 0x4000000) == 0) {
    handle_local._4_4_ = 0;
  }
  else {
    uv_once(&once,uv__udp_mmsg_init);
    handle_local._4_4_ = uv__recvmmsg_avail;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_udp_using_recvmmsg(const uv_udp_t* handle) {
#if HAVE_MMSG
  if (handle->flags & UV_HANDLE_UDP_RECVMMSG) {
    uv_once(&once, uv__udp_mmsg_init);
    return uv__recvmmsg_avail;
  }
#endif
  return 0;
}